

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddConvexPolyFilled(ImDrawList *this,ImVec2 *points,int points_count,ImU32 col)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  ImDrawVert *pIVar4;
  long lVar5;
  long lVar6;
  ImDrawIdx *pIVar7;
  int iVar8;
  ulong uVar9;
  ImDrawIdx IVar10;
  ulong uVar11;
  ulong uVar12;
  ImDrawIdx IVar13;
  int iVar14;
  ImVec2 *pIVar15;
  long lVar16;
  float fVar17;
  ImVec2 IVar18;
  ImVec2 IVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined8 uStack_a0;
  float local_98 [4];
  undefined1 local_88 [16];
  ulong local_78;
  ulong local_70;
  ImVec2 local_68;
  uint *local_60;
  ulong local_58;
  ulong local_50;
  ImU32 local_44;
  uint local_40;
  ImU32 local_3c;
  ImVec2 *local_38;
  
  if (2 < points_count) {
    uVar11 = (ulong)(uint)points_count;
    IVar18 = this->_Data->TexUvWhitePixel;
    local_38 = points;
    if ((this->Flags & 4) == 0) {
      uStack_a0 = 0x139f2e;
      PrimReserve(this,points_count * 3 + -6,points_count);
      uVar9 = 0;
      do {
        this->_VtxWritePtr->pos = local_38[uVar9];
        this->_VtxWritePtr->uv = IVar18;
        pIVar4 = this->_VtxWritePtr;
        pIVar4->col = col;
        this->_VtxWritePtr = pIVar4 + 1;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      uVar3 = this->_VtxCurrentIdx;
      iVar8 = 3;
      if (3 < points_count) {
        iVar8 = points_count;
      }
      pIVar7 = this->_IdxWritePtr;
      iVar8 = iVar8 + -2;
      iVar14 = uVar3 + 2;
      do {
        *pIVar7 = (ImDrawIdx)uVar3;
        pIVar7[1] = (ImDrawIdx)iVar14 - 1;
        pIVar7[2] = (ImDrawIdx)iVar14;
        pIVar7 = pIVar7 + 3;
        iVar14 = iVar14 + 1;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      this->_IdxWritePtr = pIVar7;
      local_40 = points_count & 0xffff;
      local_60 = &this->_VtxCurrentIdx;
    }
    else {
      local_88 = ZEXT416((uint)this->_FringeScale);
      local_3c = col & 0xffffff;
      local_40 = points_count * 2;
      uStack_a0 = 0x139fdc;
      local_68 = IVar18;
      local_44 = col;
      PrimReserve(this,points_count * 9 + -6,local_40);
      local_60 = &this->_VtxCurrentIdx;
      uVar3 = this->_VtxCurrentIdx;
      pIVar7 = this->_IdxWritePtr;
      iVar8 = points_count + -2;
      iVar14 = uVar3 + 2;
      do {
        *pIVar7 = (ImDrawIdx)uVar3;
        pIVar7[1] = (ImDrawIdx)iVar14;
        iVar14 = iVar14 + 2;
        pIVar7[2] = (ImDrawIdx)iVar14;
        pIVar7 = pIVar7 + 3;
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      local_50 = (ulong)uVar3;
      this->_IdxWritePtr = pIVar7;
      lVar5 = -(uVar11 * 8 + 0xf & 0xfffffffffffffff0);
      lVar6 = lVar5 + -0x98;
      iVar8 = points_count + -1;
      local_58 = uVar11;
      uVar11 = 1;
      if (1 < points_count) {
        uVar11 = (ulong)(uint)points_count;
      }
      uVar9 = 0;
      local_78 = (ulong)(uVar3 + 1);
      local_70 = uVar11;
      pIVar15 = local_38;
      fVar23 = (float)local_88._0_4_;
      iVar14 = iVar8;
      do {
        lVar16 = (long)iVar14;
        local_98[0] = pIVar15[uVar9].x - pIVar15[lVar16].x;
        local_98[1] = pIVar15[uVar9].y - pIVar15[lVar16].y;
        fVar17 = local_98[0] * local_98[0] + local_98[1] * local_98[1];
        if (0.0 < fVar17) {
          if (fVar17 < 0.0) {
            local_98[2] = 0.0;
            local_98[3] = 0.0;
            *(undefined8 *)((long)&uStack_a0 + lVar5) = 0x13a0aa;
            fVar17 = sqrtf(fVar17);
            uVar11 = local_70;
            pIVar15 = local_38;
            fVar23 = (float)local_88._0_4_;
          }
          else {
            fVar17 = SQRT(fVar17);
          }
          local_98[0] = local_98[0] * (1.0 / fVar17);
          local_98[1] = local_98[1] * (1.0 / fVar17);
        }
        *(float *)((long)local_98 + lVar16 * 8 + lVar6 + 0x98) = local_98[1];
        *(float *)((long)local_98 + lVar16 * 8 + lVar5 + 4) = -local_98[0];
        iVar14 = (int)uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar11 != uVar9);
      uVar11 = 1;
      if (1 < (int)local_58) {
        uVar11 = local_58 & 0xffffffff;
      }
      uVar9 = 0;
      uVar12 = local_50 & 0xffffffff;
      do {
        pIVar4 = this->_VtxWritePtr;
        uVar1 = *(undefined8 *)((long)local_98 + (long)iVar8 * 8 + lVar6 + 0x98);
        uVar2 = *(undefined8 *)((long)local_98 + uVar9 * 8 + lVar6 + 0x98);
        fVar20 = ((float)uVar2 + (float)uVar1) * 0.5;
        fVar21 = ((float)((ulong)uVar2 >> 0x20) + (float)((ulong)uVar1 >> 0x20)) * 0.5;
        fVar22 = fVar20 * fVar20 + fVar21 * fVar21;
        fVar17 = 0.5;
        if (0.5 <= fVar22) {
          fVar17 = fVar22;
        }
        fVar20 = (1.0 / fVar17) * fVar20 * fVar23 * 0.5;
        fVar17 = (1.0 / fVar17) * fVar21 * fVar23 * 0.5;
        IVar18.x = pIVar15[uVar9].x - fVar20;
        IVar18.y = pIVar15[uVar9].y - fVar17;
        pIVar4->pos = IVar18;
        pIVar4->uv = local_68;
        pIVar4 = this->_VtxWritePtr;
        pIVar4->col = local_44;
        IVar19.x = pIVar15[uVar9].x + fVar20;
        IVar19.y = pIVar15[uVar9].y + fVar17;
        pIVar4[1].pos = IVar19;
        pIVar4[1].uv = local_68;
        pIVar4 = this->_VtxWritePtr;
        pIVar4[1].col = local_3c;
        this->_VtxWritePtr = pIVar4 + 2;
        pIVar7 = this->_IdxWritePtr;
        IVar10 = (ImDrawIdx)uVar12;
        *pIVar7 = IVar10;
        pIVar7[1] = (short)local_50 + (short)iVar8 * 2;
        IVar13 = (short)local_78 + (short)iVar8 * 2;
        pIVar7[2] = IVar13;
        pIVar7[3] = IVar13;
        pIVar7[4] = IVar10 + 1;
        pIVar7[5] = IVar10;
        this->_IdxWritePtr = pIVar7 + 6;
        iVar8 = (int)uVar9;
        uVar9 = uVar9 + 1;
        uVar12 = (ulong)((int)uVar12 + 2);
      } while (uVar11 != uVar9);
      local_40 = local_40 & 0xfffe;
    }
    *local_60 = *local_60 + local_40;
  }
  return;
}

Assistant:

void ImDrawList::AddConvexPolyFilled(const ImVec2* points, const int points_count, ImU32 col)
{
    if (points_count < 3)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    if (Flags & ImDrawListFlags_AntiAliasedFill)
    {
        // Anti-aliased Fill
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;
        const int idx_count = (points_count - 2)*3 + points_count * 6;
        const int vtx_count = (points_count * 2);
        PrimReserve(idx_count, vtx_count);

        // Add indexes for fill
        unsigned int vtx_inner_idx = _VtxCurrentIdx;
        unsigned int vtx_outer_idx = _VtxCurrentIdx + 1;
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + ((i - 1) << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_inner_idx + (i << 1));
            _IdxWritePtr += 3;
        }

        // Compute normals
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * sizeof(ImVec2)); //-V630
        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            const ImVec2& p0 = points[i0];
            const ImVec2& p1 = points[i1];
            float dx = p1.x - p0.x;
            float dy = p1.y - p0.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i0].x = dy;
            temp_normals[i0].y = -dx;
        }

        for (int i0 = points_count - 1, i1 = 0; i1 < points_count; i0 = i1++)
        {
            // Average normals
            const ImVec2& n0 = temp_normals[i0];
            const ImVec2& n1 = temp_normals[i1];
            float dm_x = (n0.x + n1.x) * 0.5f;
            float dm_y = (n0.y + n1.y) * 0.5f;
            IM_FIXNORMAL2F(dm_x, dm_y);
            dm_x *= AA_SIZE * 0.5f;
            dm_y *= AA_SIZE * 0.5f;

            // Add vertices
            _VtxWritePtr[0].pos.x = (points[i1].x - dm_x); _VtxWritePtr[0].pos.y = (points[i1].y - dm_y); _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;        // Inner
            _VtxWritePtr[1].pos.x = (points[i1].x + dm_x); _VtxWritePtr[1].pos.y = (points[i1].y + dm_y); _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_trans;  // Outer
            _VtxWritePtr += 2;

            // Add indexes for fringes
            _IdxWritePtr[0] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1)); _IdxWritePtr[1] = (ImDrawIdx)(vtx_inner_idx + (i0 << 1)); _IdxWritePtr[2] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1));
            _IdxWritePtr[3] = (ImDrawIdx)(vtx_outer_idx + (i0 << 1)); _IdxWritePtr[4] = (ImDrawIdx)(vtx_outer_idx + (i1 << 1)); _IdxWritePtr[5] = (ImDrawIdx)(vtx_inner_idx + (i1 << 1));
            _IdxWritePtr += 6;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // Non Anti-aliased Fill
        const int idx_count = (points_count - 2)*3;
        const int vtx_count = points_count;
        PrimReserve(idx_count, vtx_count);
        for (int i = 0; i < vtx_count; i++)
        {
            _VtxWritePtr[0].pos = points[i]; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr++;
        }
        for (int i = 2; i < points_count; i++)
        {
            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + i - 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + i);
            _IdxWritePtr += 3;
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
}